

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

bool __thiscall efsw::FileWatcherInotify::pathInWatches(FileWatcherInotify *this,string *path)

{
  __type _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  Lock l;
  Lock local_20;
  
  local_20.mMutex = &this->mRealWatchesLock;
  Mutex::lock(local_20.mMutex);
  p_Var3 = &(this->mRealWatches)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(p_Var2[1]._M_parent)->_M_left,path);
    if (_Var1) break;
  }
  Lock::~Lock(&local_20);
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool FileWatcherInotify::pathInWatches( const std::string& path ) {
	Lock l( mRealWatchesLock );

	/// Search in the real watches, since it must allow adding a watch already watched as a subdir
	WatchMap::iterator it = mRealWatches.begin();

	for ( ; it != mRealWatches.end(); ++it )
		if ( it->second->Directory == path )
			return true;

	return false;
}